

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O1

void __thiscall swrenderer::FCoverageBuffer::FCoverageBuffer(FCoverageBuffer *this,int lists)

{
  Span **__s;
  ulong uVar1;
  
  FMemArena::FMemArena(&this->SpanArena,0x2800);
  this->Spans = (Span **)0x0;
  this->FreeSpans = (Span *)0x0;
  this->NumLists = lists;
  uVar1 = 0xffffffffffffffff;
  if (-1 < lists) {
    uVar1 = (long)lists * 8;
  }
  __s = (Span **)operator_new__(uVar1);
  this->Spans = __s;
  memset(__s,0,(long)lists * 8);
  return;
}

Assistant:

FCoverageBuffer::FCoverageBuffer(int lists)
	: Spans(NULL), FreeSpans(NULL)
{
	NumLists = lists;
	Spans = new Span *[lists];
	memset(Spans, 0, sizeof(Span*)*lists);
}